

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall
sznet::net::TcpConnection::shrinkRSBufferInLoop(TcpConnection *this,size_t sendSize,size_t recvSize)

{
  EventLoop::assertInLoopThread(this->m_loop);
  if (sendSize != 0) {
    Buffer::shrink(&this->m_outputBuffer,sendSize);
  }
  if (recvSize != 0) {
    Buffer::shrink(&this->m_inputBuffer,recvSize);
    return;
  }
  return;
}

Assistant:

void TcpConnection::shrinkRSBufferInLoop(size_t sendSize, size_t recvSize)
{
	m_loop->assertInLoopThread();
	if (sendSize > 0)
	{
		m_outputBuffer.shrink(sendSize);
	}
	if (recvSize > 0)
	{
		m_inputBuffer.shrink(recvSize);
	}
}